

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_InvalidUseFeaturesInSameFile_Test::
~FeaturesTest_InvalidUseFeaturesInSameFile_Test
          (FeaturesTest_InvalidUseFeaturesInSameFile_Test *this)

{
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_018e2b28;
  DescriptorPool::~DescriptorPool(&(this->super_FeaturesTest).super_FeaturesBaseTest.pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(FeaturesTest, InvalidUseFeaturesInSameFile) {
  BuildDescriptorMessagesInTestPool();
  ParseAndBuildFileWithErrors("foo.proto", R"schema(
    edition = "2023";

    package test;
    import "google/protobuf/descriptor.proto";

    message Foo {
      string bar = 1 [
        features.(test.custom).foo = "xyz",
        features.(test.another) = {foo: -321}
      ];
    }

    message Custom {
      string foo = 1 [features = { [test.custom]: {foo: "abc"} }];
    }
    message Another {
      Enum foo = 1;
    }

    enum Enum {
      option features.enum_type = CLOSED;
      ZERO = 0;
      ONE = 1;
    }

    extend google.protobuf.FeatureSet {
      Custom custom = 1002 [features.message_encoding=DELIMITED];
      Another another = 1001;
    }
  )schema",
                              "foo.proto: test.Foo.bar: OPTION_NAME: Feature "
                              "\"features.(test.custom)\" can't be used in the "
                              "same file it's defined in.\n");
}